

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server::privilegemsg(int min_privilege,char *fmt,...)

{
  int iVar1;
  char in_AL;
  int iVar2;
  clientinfo **ppcVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  va_list ap;
  char *fmt_local;
  int min_privilege_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_f8;
  ap[0]._0_8_ = &stack0x00000008;
  i = 0x30;
  local_38 = (undefined1  [4])0x10;
  local_3c = 0;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  while( true ) {
    iVar1 = local_3c;
    iVar2 = vector<server::clientinfo_*>::length((vector<server::clientinfo_*> *)clients);
    if (iVar2 <= iVar1) break;
    ppcVar3 = vector<server::clientinfo_*>::operator[]
                        ((vector<server::clientinfo_*> *)clients,local_3c);
    if (min_privilege <= (*ppcVar3)->privilege) {
      ppcVar3 = vector<server::clientinfo_*>::operator[]
                          ((vector<server::clientinfo_*> *)clients,local_3c);
      if (*ppcVar3 != (clientinfo *)0x0) {
        ppcVar3 = vector<server::clientinfo_*>::operator[]
                            ((vector<server::clientinfo_*> *)clients,local_3c);
        vmessage((*ppcVar3)->clientnum,fmt,(__va_list_tag *)local_38);
      }
    }
    local_3c = local_3c + 1;
  }
  return;
}

Assistant:

void privilegemsg(int min_privilege, const char *fmt, ...) {
        va_list ap;
        va_start(ap, fmt);
        loopv(clients) if(clients[i]->privilege >= min_privilege && clients[i]) vmessage(clients[i]->clientnum, fmt, ap);
        va_end(ap);
    }